

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O0

bool __thiscall ritobin::io::impl_binary_read::BinBinaryReader::read_entries(BinBinaryReader *this)

{
  pointer *this_00;
  uint32_t h;
  char *pos;
  bool bVar1;
  reference puVar2;
  vector<ritobin::Field,_std::allocator<ritobin::Field>_> *this_01;
  variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_220;
  variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_1d8;
  Pair local_190;
  char *local_100;
  char *start_2;
  Embed entry;
  Hash entryKeyHash;
  iterator iStack_88;
  uint32_t entryNameHash;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  Map entriesMap;
  char *start_1;
  char *start;
  vector<unsigned_int,_std::allocator<unsigned_int>_> entryNameHashes;
  uint32_t entryCount;
  BinBinaryReader *this_local;
  
  entryNameHashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start);
  pos = (this->reader).cur_;
  bVar1 = BinaryReader::read<unsigned_int>
                    (&this->reader,
                     (uint *)((long)&entryNameHashes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if (bVar1) {
    entriesMap.items.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(this->reader).cur_;
    bVar1 = BinaryReader::read<unsigned_int>
                      (&this->reader,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start,
                       (ulong)entryNameHashes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar1) {
      __range3._0_1_ = 0x11;
      __range3._1_1_ = 0x83;
      memset(&entriesMap,0,0x18);
      std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::vector
                ((vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> *)&entriesMap);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start);
      iStack_88 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          (&__end3,&stack0xffffffffffffff78);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        h = *puVar2;
        this_00 = &entry.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        memset(this_00,0,0x28);
        FNV1a::FNV1a((FNV1a *)this_00);
        FNV1a::FNV1a((FNV1a *)&start_2,h);
        this_01 = (vector<ritobin::Field,_std::allocator<ritobin::Field>_> *)
                  ((long)&entry.name.str_.field_2 + 8);
        memset(this_01,0,0x18);
        std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::vector(this_01);
        local_100 = (this->reader).cur_;
        bVar1 = read_entry(this,(Hash *)&entry.items.
                                         super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Embed *)&start_2);
        if (bVar1) {
          std::
          variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
          ::variant<ritobin::Hash,void,void,ritobin::Hash,void>
                    ((variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
                      *)&local_1d8,
                     (Hash *)&entry.items.
                              super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
          ::variant<ritobin::Embed,void,void,ritobin::Embed,void>
                    ((variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>
                      *)&local_220,(Embed *)&start_2);
          Pair::Pair(&local_190,(Value *)&local_1d8,(Value *)&local_220);
          std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::emplace_back<ritobin::Pair>
                    ((vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> *)&entriesMap,&local_190
                    );
          Pair::~Pair(&local_190);
          std::
          variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~variant(&local_220);
          std::
          variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~variant(&local_1d8);
        }
        else {
          this_local._7_1_ = fail_msg(this,"read_entry(entryKeyHash, entry)",local_100);
        }
        Embed::~Embed((Embed *)&start_2);
        Hash::~Hash((Hash *)&entry.items.
                             super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) goto LAB_0012bcc7;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
      std::
      unordered_map<std::__cxx11::string,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>>
      ::emplace<char_const(&)[8],ritobin::Map>
                ((unordered_map<std::__cxx11::string,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>>
                  *)this->bin,(char (*) [8])"entries",(Map *)&__range3);
      this_local._7_1_ = 1;
LAB_0012bcc7:
      Map::~Map((Map *)&__range3);
    }
    else {
      this_local._7_1_ =
           fail_msg(this,"reader.read(entryNameHashes, entryCount)",
                    (char *)entriesMap.items.
                            super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._7_1_ = fail_msg(this,"reader.read(entryCount)",pos);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool read_entries() noexcept {
            uint32_t entryCount = 0;
            std::vector<uint32_t> entryNameHashes;
            bin_assert(reader.read(entryCount));
            bin_assert(reader.read(entryNameHashes, entryCount));
            Map entriesMap = { Type::HASH,  Type::EMBED, {} };
            for (uint32_t entryNameHash : entryNameHashes) {
                Hash entryKeyHash = {};
                Embed entry = { { entryNameHash }, {} };
                bin_assert(read_entry(entryKeyHash, entry));
                entriesMap.items.emplace_back(Pair{ std::move(entryKeyHash), std::move(entry) });
            }
            bin.sections.emplace("entries", std::move(entriesMap));
            return true;
        }